

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_image *
nk_subimage_id(nk_image *__return_storage_ptr__,int id,unsigned_short w,unsigned_short h,nk_rect r)

{
  undefined1 auVar1 [16];
  
  (__return_storage_ptr__->handle).ptr = (void *)0x0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->region[0] = 0;
  __return_storage_ptr__->region[1] = 0;
  *(undefined8 *)(__return_storage_ptr__->region + 2) = 0;
  (__return_storage_ptr__->handle).id = id;
  __return_storage_ptr__->w = w;
  __return_storage_ptr__->h = h;
  auVar1._0_4_ = (int)r.x;
  auVar1._4_4_ = (int)r.y;
  auVar1._8_4_ = (int)r.w;
  auVar1._12_4_ = (int)r.h;
  auVar1 = pshuflw(auVar1,auVar1,0xe8);
  auVar1 = pshufhw(auVar1,auVar1,0xe8);
  *(ulong *)__return_storage_ptr__->region = CONCAT44(auVar1._8_4_,auVar1._0_4_);
  return __return_storage_ptr__;
}

Assistant:

NK_API struct nk_image
nk_subimage_id(int id, unsigned short w, unsigned short h, struct nk_rect r)
{
struct nk_image s;
nk_zero(&s, sizeof(s));
s.handle.id = id;
s.w = w; s.h = h;
s.region[0] = (unsigned short)r.x;
s.region[1] = (unsigned short)r.y;
s.region[2] = (unsigned short)r.w;
s.region[3] = (unsigned short)r.h;
return s;
}